

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O0

void aom_dc_left_predictor_8x16_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  undefined8 uVar1;
  uint8_t *in_RCX;
  ptrdiff_t in_RSI;
  uint8_t *in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qb;
  undefined1 auVar2 [16];
  __m128i row;
  __m128i eight;
  __m128i sum_left;
  __m128i local_d8;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined1 local_b8 [16];
  ptrdiff_t local_98;
  uint8_t *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  short local_78;
  short sStack_76;
  short sStack_74;
  short sStack_72;
  short sStack_70;
  short sStack_6e;
  short sStack_6c;
  short sStack_6a;
  undefined2 local_5e;
  undefined4 local_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  
  local_98 = in_RSI;
  local_90 = in_RDI;
  dc_sum_16_sse2(in_RCX);
  local_5e = 8;
  local_2 = 8;
  local_4 = 8;
  local_6 = 8;
  local_8 = 8;
  local_a = 8;
  local_c = 8;
  local_e = 8;
  local_10 = 8;
  local_c8 = 0x8000800080008;
  uStack_c0 = 0x8000800080008;
  local_78 = (short)extraout_XMM0_Qa;
  sStack_76 = (short)((ulong)extraout_XMM0_Qa >> 0x10);
  sStack_74 = (short)((ulong)extraout_XMM0_Qa >> 0x20);
  sStack_72 = (short)((ulong)extraout_XMM0_Qa >> 0x30);
  sStack_70 = (short)extraout_XMM0_Qb;
  sStack_6e = (short)((ulong)extraout_XMM0_Qb >> 0x10);
  sStack_6c = (short)((ulong)extraout_XMM0_Qb >> 0x20);
  sStack_6a = (short)((ulong)extraout_XMM0_Qb >> 0x30);
  local_b8._2_2_ = sStack_76 + 8;
  local_b8._0_2_ = local_78 + 8;
  local_b8._4_2_ = sStack_74 + 8;
  local_b8._6_2_ = sStack_72 + 8;
  local_b8._8_2_ = sStack_70 + 8;
  local_b8._10_2_ = sStack_6e + 8;
  local_b8._12_2_ = sStack_6c + 8;
  local_b8._14_2_ = sStack_6a + 8;
  local_58 = local_b8._0_8_;
  uStack_50 = local_b8._8_8_;
  local_5c = 4;
  auVar2._8_8_ = local_b8._8_8_;
  auVar2._0_8_ = local_b8._0_8_;
  auVar2 = psraw(auVar2,ZEXT416(4));
  local_b8._0_8_ = auVar2._0_8_;
  local_b8._8_8_ = auVar2._8_8_;
  local_38 = local_b8._0_8_;
  uVar1 = local_38;
  uStack_30 = local_b8._8_8_;
  local_48 = local_b8._0_8_;
  uStack_40 = local_b8._8_8_;
  local_38._0_1_ = auVar2[0];
  local_38._1_1_ = auVar2[1];
  local_38._2_1_ = auVar2[2];
  local_38._3_1_ = auVar2[3];
  local_38._4_1_ = auVar2[4];
  local_38._5_1_ = auVar2[5];
  local_38._6_1_ = auVar2[6];
  local_38._7_1_ = auVar2[7];
  local_b8[1] = (undefined1)local_38;
  local_b8[0] = (undefined1)local_38;
  local_b8[2] = local_38._1_1_;
  local_b8[3] = local_38._1_1_;
  local_b8[4] = local_38._2_1_;
  local_b8[5] = local_38._2_1_;
  local_b8[6] = local_38._3_1_;
  local_b8[7] = local_38._3_1_;
  local_b8[8] = local_38._4_1_;
  local_b8[9] = local_38._4_1_;
  local_b8[10] = local_38._5_1_;
  local_b8[0xb] = local_38._5_1_;
  local_b8[0xc] = local_38._6_1_;
  local_b8[0xd] = local_38._6_1_;
  local_b8[0xe] = local_38._7_1_;
  local_b8[0xf] = local_38._7_1_;
  local_d8 = (__m128i)pshuflw(local_b8,local_b8,0);
  local_88 = local_c8;
  uStack_80 = uStack_c0;
  local_38 = uVar1;
  local_28 = local_c8;
  uStack_20 = uStack_c0;
  dc_store_8xh(&local_d8,0x10,local_90,local_98);
  return;
}

Assistant:

void aom_dc_left_predictor_8x16_sse2(uint8_t *dst, ptrdiff_t stride,
                                     const uint8_t *above,
                                     const uint8_t *left) {
  (void)above;
  __m128i sum_left = dc_sum_16_sse2(left);
  const __m128i eight = _mm_set1_epi16(8);
  sum_left = _mm_add_epi16(sum_left, eight);
  sum_left = _mm_srai_epi16(sum_left, 4);
  sum_left = _mm_unpacklo_epi8(sum_left, sum_left);
  const __m128i row = _mm_shufflelo_epi16(sum_left, 0);
  dc_store_8xh(&row, 16, dst, stride);
}